

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O2

uint8_t * apx_attributeParser_parse_type_attributes
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_typeAttributes_t *attr)

{
  byte bVar1;
  _Bool unary_minus;
  uint8_t *pBegin;
  uint8_t *puVar2;
  byte *pBegin_00;
  byte *pEnd;
  adt_str_t *pElem;
  ushort **ppuVar3;
  uint8_t *puVar4;
  apx_valueTable_t *computation;
  apx_error_t aVar5;
  byte *pbVar6;
  int32_t local_8c;
  double d;
  apx_attributeParserValueTableState_t local_80;
  apx_typeAttributes_t *local_38;
  
  local_38 = attr;
  if (((end == (uint8_t *)0x0) || (begin == (uint8_t *)0x0)) || (end < begin)) {
    aVar5 = 1;
LAB_00122edc:
    apx_attributeParser_set_error(self,aVar5,begin);
    pBegin = (uint8_t *)0x0;
  }
  else {
    while( true ) {
      if (end <= begin) {
        return begin;
      }
      pBegin = bstr_lstrip(begin,end);
      if (pBegin == end) {
        return pBegin;
      }
      puVar2 = bstr_match_cstr(pBegin,end,"VT");
      if (puVar2 <= pBegin) break;
      if (pBegin + 2 < end) {
        if (pBegin[2] == '(') {
          puVar2 = pBegin + 3;
          apx_attributeParserValueTableState_create(&local_80);
LAB_00122ab7:
          do {
            if ((end <= puVar2) || (pBegin_00 = bstr_lstrip(puVar2,end), end <= pBegin_00))
            goto LAB_00122e83;
            bVar1 = *pBegin_00;
            pbVar6 = pBegin_00;
            if (local_80.last_was_string == false) {
              if ((ulong)bVar1 == 0x22) goto LAB_00122b01;
              if (bVar1 == 0x2d) {
                unary_minus = true;
                pbVar6 = pBegin_00 + 1;
              }
              else {
                ppuVar3 = __ctype_b_loc();
                unary_minus = false;
                if ((*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 8) == 0) goto LAB_00122e0b;
              }
              if (local_80.num_count == 1) {
                pEnd = apx_attributeParser_parse_upper_limit(pbVar6,end,unary_minus,&local_80.range)
                ;
              }
              else if (local_80.num_count == 0) {
                pEnd = apx_attributeParser_parse_lower_limit(pbVar6,end,unary_minus,&local_80.range)
                ;
              }
              else {
                pEnd = (byte *)0x0;
              }
              if (pbVar6 < pEnd) {
                pbVar6 = pEnd;
              }
              local_80.num_count = local_80.num_count + 1;
              goto LAB_00122baf;
            }
            if (bVar1 != 0x22) {
LAB_00122e0b:
              pbVar6 = (byte *)0x0;
LAB_00122e0e:
              pBegin_00 = pbVar6;
              aVar5 = 3;
LAB_00122e18:
              apx_attributeParser_set_error(self,aVar5,pBegin_00);
              goto LAB_00122e83;
            }
LAB_00122b01:
            local_80.last_was_string = true;
            pEnd = bstr_match_pair(pBegin_00,end,'\"','\"','\\');
            if (pBegin_00 < pEnd) {
              pElem = adt_str_new_bstr(pBegin_00 + 1,pEnd);
              if (pElem != (adt_str_t *)0x0) {
                adt_ary_push(&local_80.values,pElem);
                pbVar6 = pEnd + 1;
                goto LAB_00122baf;
              }
              aVar5 = 2;
              goto LAB_00122e18;
            }
LAB_00122baf:
            if (pEnd == (byte *)0x0) goto LAB_00122e0e;
            if (pbVar6 <= pBegin_00) goto LAB_00122e83;
            if (end < pbVar6) {
              __assert_fail("result <= end",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                            ,0x367,
                            "const uint8_t *apx_attributeParser_parse_value_table(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_valueTable_t **)"
                           );
            }
            puVar2 = bstr_lstrip(pbVar6,end);
            if (*puVar2 == ',') {
              puVar2 = puVar2 + 1;
              goto LAB_00122ab7;
            }
          } while (*puVar2 != ')');
          computation = apx_attributeParser_create_value_table_from_state(self,&local_80);
          if (computation == (apx_valueTable_t *)0x0) {
            self->error_next = puVar2;
          }
LAB_00122e3d:
          puVar2 = puVar2 + 1;
        }
        else {
LAB_00122e04:
          computation = (apx_valueTable_t *)0x0;
          puVar2 = (uint8_t *)0x0;
        }
      }
      else {
LAB_00122e83:
        puVar2 = pBegin + 2;
        computation = (apx_valueTable_t *)0x0;
      }
LAB_00122e89:
      puVar4 = pBegin + 2;
      if (puVar2 <= puVar4) goto LAB_00122f29;
      if (end < puVar2) {
        __assert_fail("result <= end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                      ,0x246,
                      "const uint8_t *apx_attributeParser_parse_single_type_attribute(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_typeAttributes_t *)"
                     );
      }
      if (computation != (apx_valueTable_t *)0x0) {
        apx_typeAttributes_append_computation(local_38,&computation->base);
      }
      if (puVar2 <= pBegin) {
        return pBegin;
      }
      begin = bstr_lstrip(puVar2,end);
      if (begin == end) {
        return begin;
      }
      if (*begin != ',') {
        aVar5 = 3;
        goto LAB_00122edc;
      }
      begin = begin + 1;
    }
    puVar4 = bstr_match_cstr(pBegin,end,"RS");
    puVar2 = pBegin + 2;
    if (pBegin < puVar4) {
      if (puVar2 < end) {
        if (*puVar2 == '(') {
          puVar2 = pBegin + 3;
          local_80.range.lower = (anon_union_4_2_43a9a9ed_for_lower)0x0;
          local_80.range.upper = (anon_union_4_2_43a9a9ed_for_upper)0x0;
          local_80.range.is_signed_range = false;
          local_80.values.pDestructor = (_func_void_void_ptr *)0x0;
          local_80.values.ppAlloc = (void **)0x0;
          local_80.values.pFirst = (void **)0x0;
          local_80.values.s32AllocLen = 0;
LAB_00122c53:
          do {
            if (end <= puVar2) {
LAB_00122e5f:
              if (self->error_next == (uint8_t *)0x0) {
                self->last_error = 3;
                self->error_next = puVar2;
              }
              free(local_80.values.pDestructor);
              goto LAB_00122e83;
            }
            puVar2 = bstr_lstrip(puVar2,end);
            if (end <= puVar2) {
LAB_00122e5d:
              puVar2 = (uint8_t *)0x0;
              goto LAB_00122e5f;
            }
            d = 0.0;
            local_8c = 0;
            switch(local_80.values.s32AllocLen) {
            case 0:
              puVar4 = apx_attributeParser_parse_lower_limit
                                 (puVar2 + (*puVar2 == '-'),end,*puVar2 == '-',&local_80.range);
              break;
            case 1:
              puVar4 = apx_attributeParser_parse_upper_limit
                                 (puVar2 + (*puVar2 == '-'),end,*puVar2 == '-',&local_80.range);
              break;
            case 2:
              puVar4 = apx_parserBase_parse_double(puVar2,end,&d);
              if (puVar2 < puVar4) {
                local_80.values.ppAlloc = (void **)d;
              }
              break;
            case 3:
              puVar4 = apx_parserBase_parse_i32(puVar2,end,&local_8c);
              if (puVar2 < puVar4) {
                local_80.values.pFirst = (void **)CONCAT44(local_80.values.pFirst._4_4_,local_8c);
              }
              break;
            case 4:
              puVar4 = apx_parserBase_parse_i32(puVar2,end,&local_8c);
              if (puVar2 < puVar4) {
                local_80.values.pFirst = (void **)CONCAT44(local_8c,local_80.values.pFirst._0_4_);
              }
              break;
            case 5:
              puVar4 = bstr_match_pair(puVar2,end,'\"','\"','\\');
              if (puVar2 < puVar4) {
                local_80.values.pDestructor =
                     (_func_void_void_ptr *)bstr_make_cstr(puVar2 + 1,puVar4);
                if (local_80.values.pDestructor == (_func_void_void_ptr *)0x0) {
                  apx_attributeParser_set_error(self,2,puVar2);
                  goto LAB_00122e5d;
                }
                puVar4 = puVar4 + 1;
              }
              break;
            default:
              puVar4 = (uint8_t *)0x0;
            }
            local_80.values.s32AllocLen = local_80.values.s32AllocLen + 1;
            if (puVar4 <= puVar2) goto LAB_00122e5d;
            if (end < puVar4) {
              __assert_fail("result <= end",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                            ,0x397,
                            "const uint8_t *apx_attributeParser_parse_rational_scaling(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_rationalScaling_t **)"
                           );
            }
            puVar2 = bstr_lstrip(puVar4,end);
            if (*puVar2 == ',') {
              puVar2 = puVar2 + 1;
              goto LAB_00122c53;
            }
          } while (*puVar2 != ')');
          computation = (apx_valueTable_t *)
                        apx_attributeParser_create_rational_scaling_from_state
                                  ((apx_attributeParserRationalScalingState_t *)&local_80);
          free(local_80.values.pDestructor);
          if (computation != (apx_valueTable_t *)0x0) goto LAB_00122e3d;
          apx_attributeParser_set_error(self,2,puVar2);
        }
        goto LAB_00122e04;
      }
      computation = (apx_valueTable_t *)0x0;
      goto LAB_00122e89;
    }
    apx_attributeParser_set_error(self,3,pBegin);
    puVar4 = pBegin;
LAB_00122f29:
    apx_attributeParser_set_error(self,3,puVar4);
  }
  return pBegin;
}

Assistant:

uint8_t const* apx_attributeParser_parse_type_attributes(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_typeAttributes_t* attr)
{
   uint8_t const* next = begin;
   if ((end < begin) || (begin == NULL) || (end == NULL))
   {
      apx_attributeParser_set_error(self, APX_INVALID_ARGUMENT_ERROR, begin);
      return NULL;
   }
   while (next < end)
   {
      next = bstr_lstrip(next, end);
      if (next == end)
      {
         break;
      }
      uint8_t const* result = apx_attributeParser_parse_single_type_attribute(self, next, end, attr);
      if (result > next)
      {
         next = bstr_lstrip(result, end);
         if (next == end)
         {
            break;
         }
         if (*next == ',')
         {
            next++;
         }
         else
         {
            apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
            next = NULL;
            break;
         }
      }
      else
      {
         break;
      }
   }
   return next;
}